

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_mutex_extension.h
# Opt level: O2

void __thiscall dlib::auto_mutex::unlock(auto_mutex *this)

{
  rmutex **pprVar1;
  read_write_mutex **pprVar2;
  
  if ((pthread_mutex_t *)this->m == (pthread_mutex_t *)0x0) {
    pprVar1 = &this->r;
    if (*pprVar1 == (rmutex *)0x0) {
      pprVar2 = &this->rw;
      if (*pprVar2 == (read_write_mutex *)0x0) {
        return;
      }
      this = (auto_mutex *)&this->rw;
      read_write_mutex::unlock(*pprVar2);
    }
    else {
      this = (auto_mutex *)&this->r;
      rmutex::unlock(*pprVar1,1);
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)this->m);
  }
  this->m = (mutex *)0x0;
  return;
}

Assistant:

void unlock()
        {
            if (m != 0)
            {
                m->unlock();
                m = 0;
            }
            else if (r != 0)
            {
                r->unlock();
                r = 0;
            }
            else if (rw != 0)
            {
                rw->unlock();
                rw = 0;
            }
        }